

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

void google::protobuf::internal::InitSCC(SCCInfoBase *scc)

{
  int *in_RDI;
  __int_type_conflict status;
  memory_order __b;
  SCCInfoBase *in_stack_00000058;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  if (*in_RDI != 0) {
    InitSCCImpl(in_stack_00000058);
  }
  return;
}

Assistant:

inline void InitSCC(SCCInfoBase* scc) {
  auto status = scc->visit_status.load(std::memory_order_acquire);
  if (PROTOBUF_PREDICT_FALSE(status != SCCInfoBase::kInitialized))
    InitSCCImpl(scc);
}